

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O0

void __thiscall nv::DDSHeader::setFourCC(DDSHeader *this,uint8 c0,uint8 c1,uint8 c2,uint8 c3)

{
  uint8 c3_local;
  uint8 c2_local;
  uint8 c1_local;
  uint8 c0_local;
  DDSHeader *this_local;
  
  (this->pf).flags = 4;
  (this->pf).fourcc = CONCAT13(c3,CONCAT12(c2,CONCAT11(c1,c0)));
  if ((this->pf).fourcc == 0x32495441) {
    (this->pf).bitcount = 0x59583241;
  }
  else {
    (this->pf).bitcount = 0;
  }
  (this->pf).rmask = 0;
  (this->pf).gmask = 0;
  (this->pf).bmask = 0;
  (this->pf).amask = 0;
  return;
}

Assistant:

void DDSHeader::setFourCC(uint8 c0, uint8 c1, uint8 c2, uint8 c3)
{
	// set fourcc pixel format.
	this->pf.flags = DDPF_FOURCC;
	this->pf.fourcc = MAKEFOURCC(c0, c1, c2, c3);
	
	if (this->pf.fourcc == FOURCC_ATI2)
	{
		this->pf.bitcount = FOURCC_A2XY;
	}
	else
	{
		this->pf.bitcount = 0;
	}
	
	this->pf.rmask = 0;
	this->pf.gmask = 0;
	this->pf.bmask = 0;
	this->pf.amask = 0;
}